

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

int test_ecdsa_der_parse(uchar *sig,size_t siglen,int certainly_der,int certainly_not_der)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  void *in_RDI;
  bool bVar4;
  bool bVar5;
  int roundtrips_der_lax;
  int valid_der_lax;
  int parsed_der_lax;
  size_t len_der_lax;
  uchar compact_der_lax [64];
  uchar roundtrip_der_lax [2048];
  secp256k1_ecdsa_signature sig_der_lax;
  int roundtrips_der;
  int valid_der;
  int parsed_der;
  size_t len_der;
  uchar compact_der [64];
  uchar roundtrip_der [2048];
  secp256k1_ecdsa_signature sig_der;
  int ret;
  bool local_1160;
  bool local_115e;
  undefined1 local_1148 [24];
  secp256k1_ecdsa_signature *in_stack_ffffffffffffeed0;
  secp256k1_ecdsa_signature *in_stack_ffffffffffffeed8;
  secp256k1_ecdsa_signature *in_stack_ffffffffffffeee0;
  secp256k1_context *in_stack_ffffffffffffeee8;
  undefined1 local_1108 [24];
  size_t in_stack_ffffffffffffef10;
  uchar *in_stack_ffffffffffffef18;
  secp256k1_ecdsa_signature *in_stack_ffffffffffffef20;
  secp256k1_context *in_stack_ffffffffffffef28;
  undefined1 local_8a8 [32];
  undefined1 auStack_888 [32];
  undefined1 local_868 [2124];
  uint local_1c;
  int local_18;
  int local_14;
  long local_10;
  void *local_8;
  
  local_1c = 0;
  bVar4 = false;
  local_115e = false;
  bVar5 = false;
  local_1160 = false;
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  iVar1 = secp256k1_ecdsa_signature_parse_der
                    (in_stack_ffffffffffffeee8,in_stack_ffffffffffffeee0,
                     in_stack_ffffffffffffeed8->data,(size_t)in_stack_ffffffffffffeed0);
  if (iVar1 != 0) {
    iVar2 = secp256k1_ecdsa_signature_serialize_compact
                      (in_stack_ffffffffffffeee8,in_stack_ffffffffffffeee0->data,
                       in_stack_ffffffffffffeed8);
    local_1c = (iVar2 != 0 ^ 0xffU) & 1 | local_1c;
    iVar2 = secp256k1_memcmp_var(local_8a8,"",0x20);
    bVar4 = false;
    if (iVar2 != 0) {
      iVar2 = secp256k1_memcmp_var(auStack_888,"",0x20);
      bVar4 = iVar2 != 0;
    }
  }
  if (bVar4) {
    iVar2 = secp256k1_ecdsa_signature_serialize_der
                      (in_stack_ffffffffffffeee8,in_stack_ffffffffffffeee0->data,
                       (size_t *)in_stack_ffffffffffffeed8,in_stack_ffffffffffffeed0);
    local_1c = (uint)((iVar2 != 0 ^ 0xffU) & 1) << 1 | local_1c;
    local_115e = false;
    if (local_10 == 0x800) {
      iVar2 = secp256k1_memcmp_var(local_868,local_8,0x800);
      local_115e = iVar2 == 0;
    }
  }
  iVar2 = ecdsa_signature_parse_der_lax
                    (in_stack_ffffffffffffef28,in_stack_ffffffffffffef20,in_stack_ffffffffffffef18,
                     in_stack_ffffffffffffef10);
  if (iVar2 != 0) {
    iVar3 = secp256k1_ecdsa_signature_serialize_compact
                      (in_stack_ffffffffffffeee8,in_stack_ffffffffffffeee0->data,
                       in_stack_ffffffffffffeed8);
    local_1c = (uint)((iVar3 != 0 ^ 0xffU) & 1) << 10 | local_1c;
    iVar3 = secp256k1_memcmp_var(local_1148,"",0x20);
    bVar5 = false;
    if (iVar3 != 0) {
      iVar3 = secp256k1_memcmp_var(&stack0xffffffffffffeed8,"",0x20);
      bVar5 = iVar3 != 0;
    }
  }
  if (bVar5) {
    iVar3 = secp256k1_ecdsa_signature_serialize_der
                      (in_stack_ffffffffffffeee8,in_stack_ffffffffffffeee0->data,
                       (size_t *)in_stack_ffffffffffffeed8,in_stack_ffffffffffffeed0);
    local_1c = (uint)((iVar3 != 0 ^ 0xffU) & 1) << 0xb | local_1c;
    local_1160 = false;
    if (local_10 == 0x800) {
      iVar3 = secp256k1_memcmp_var(local_1108,local_8,0x800);
      local_1160 = iVar3 == 0;
    }
  }
  if (local_14 != 0) {
    local_1c = (uint)((iVar1 != 0 ^ 0xffU) & 1) << 2 | local_1c;
  }
  if (local_18 != 0) {
    local_1c = iVar1 << 0x11 | local_1c;
  }
  if (bVar4) {
    local_1c = (uint)((local_1160 != false ^ 0xffU) & 1) << 0xc |
               (uint)((local_115e != false ^ 0xffU) & 1) << 3 | local_1c;
    iVar3 = secp256k1_memcmp_var(local_1108,local_868,0x800);
    local_1c = (uint)(iVar3 != 0) << 0xe | local_1c;
  }
  local_1c = (uint)(local_115e != local_1160) << 0xf | local_1c;
  if (iVar1 != 0) {
    local_1c = (uint)((iVar2 != 0 ^ 0xffU) & 1) << 0x10 | local_1c;
  }
  return local_1c;
}

Assistant:

static int test_ecdsa_der_parse(const unsigned char *sig, size_t siglen, int certainly_der, int certainly_not_der) {
    static const unsigned char zeroes[32] = {0};

    int ret = 0;

    secp256k1_ecdsa_signature sig_der;
    unsigned char roundtrip_der[2048];
    unsigned char compact_der[64];
    size_t len_der = 2048;
    int parsed_der = 0, valid_der = 0, roundtrips_der = 0;

    secp256k1_ecdsa_signature sig_der_lax;
    unsigned char roundtrip_der_lax[2048];
    unsigned char compact_der_lax[64];
    size_t len_der_lax = 2048;
    int parsed_der_lax = 0, valid_der_lax = 0, roundtrips_der_lax = 0;

    parsed_der = secp256k1_ecdsa_signature_parse_der(CTX, &sig_der, sig, siglen);
    if (parsed_der) {
        ret |= (!secp256k1_ecdsa_signature_serialize_compact(CTX, compact_der, &sig_der)) << 0;
        valid_der = (secp256k1_memcmp_var(compact_der, zeroes, 32) != 0) && (secp256k1_memcmp_var(compact_der + 32, zeroes, 32) != 0);
    }
    if (valid_der) {
        ret |= (!secp256k1_ecdsa_signature_serialize_der(CTX, roundtrip_der, &len_der, &sig_der)) << 1;
        roundtrips_der = (len_der == siglen) && secp256k1_memcmp_var(roundtrip_der, sig, siglen) == 0;
    }

    parsed_der_lax = ecdsa_signature_parse_der_lax(CTX, &sig_der_lax, sig, siglen);
    if (parsed_der_lax) {
        ret |= (!secp256k1_ecdsa_signature_serialize_compact(CTX, compact_der_lax, &sig_der_lax)) << 10;
        valid_der_lax = (secp256k1_memcmp_var(compact_der_lax, zeroes, 32) != 0) && (secp256k1_memcmp_var(compact_der_lax + 32, zeroes, 32) != 0);
    }
    if (valid_der_lax) {
        ret |= (!secp256k1_ecdsa_signature_serialize_der(CTX, roundtrip_der_lax, &len_der_lax, &sig_der_lax)) << 11;
        roundtrips_der_lax = (len_der_lax == siglen) && secp256k1_memcmp_var(roundtrip_der_lax, sig, siglen) == 0;
    }

    if (certainly_der) {
        ret |= (!parsed_der) << 2;
    }
    if (certainly_not_der) {
        ret |= (parsed_der) << 17;
    }
    if (valid_der) {
        ret |= (!roundtrips_der) << 3;
    }

    if (valid_der) {
        ret |= (!roundtrips_der_lax) << 12;
        ret |= (len_der != len_der_lax) << 13;
        ret |= ((len_der != len_der_lax) || (secp256k1_memcmp_var(roundtrip_der_lax, roundtrip_der, len_der) != 0)) << 14;
    }
    ret |= (roundtrips_der != roundtrips_der_lax) << 15;
    if (parsed_der) {
        ret |= (!parsed_der_lax) << 16;
    }

    return ret;
}